

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divider_tests.cpp
# Opt level: O2

void __thiscall
DividerTest_Long_DivideBy_Long_Test::~DividerTest_Long_DivideBy_Long_Test
          (DividerTest_Long_DivideBy_Long_Test *this)

{
  DividerTest::~DividerTest(&this->super_DividerTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DividerTest, Long_DivideBy_Long) {
  verify(3);
}